

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O0

void CDTUtil::writeBASICLoader(path *fname,byte screenMode,byte *palette)

{
  allocator<char> local_121;
  string local_120;
  undefined4 local_fc;
  byte local_f8 [4];
  aint basiclen;
  byte basic [160];
  int local_50;
  word himem;
  word callad;
  aint n;
  aint i;
  byte p [32];
  byte border;
  byte mode_values [3];
  byte *palette_local;
  byte screenMode_local;
  path *fname_local;
  
  p[0x1d] = '\x0e';
  p[0x1e] = '\x0f';
  p[0x1f] = '\x10';
  p[0x1c] = *palette;
  local_50 = 0;
  for (_himem = 0; _himem < 0x10; _himem = _himem + 1) {
    *(byte *)((long)&n + (long)local_50) = palette[(long)_himem + 1] / 10 + 0x30;
    *(byte *)((long)&n + (long)(local_50 + 1)) = palette[(long)_himem + 1] % 10 + 0x30;
    local_50 = local_50 + 2;
  }
  basic[0x9e] = '\0';
  basic[0x9f] = 0x80;
  basic[0x9c] = 0xff;
  basic[0x9d] = '\x7f';
  local_f8[0] = '\x0f';
  local_f8[1] = 0;
  local_f8[2] = 10;
  local_f8[3] = 0;
  basiclen._0_1_ = 0xad;
  basiclen._1_1_ = 0x20;
  basiclen._2_1_ = p[(ulong)screenMode + 0x1d];
  basiclen._3_1_ = 1;
  basic[0] = 0x8a;
  basic[1] = '\x01';
  basic[2] = 0x82;
  basic[3] = ' ';
  basic[4] = '\x19';
  basic[5] = p[0x1c];
  basic[6] = '\0';
  basic[7] = '6';
  basic[8] = '\0';
  basic[9] = '\x14';
  basic[10] = '\0';
  basic[0xb] = 0x8c;
  basic[0xc] = ' ';
  basic[0xd] = (byte)n;
  basic[0xe] = n._1_1_;
  basic[0xf] = ',';
  basic[0x10] = n._2_1_;
  basic[0x11] = n._3_1_;
  basic[0x12] = ',';
  basic[0x13] = (byte)i;
  basic[0x14] = i._1_1_;
  basic[0x15] = ',';
  basic[0x16] = i._2_1_;
  basic[0x17] = i._3_1_;
  basic[0x18] = ',';
  basic[0x19] = p[0];
  basic[0x1a] = p[1];
  basic[0x1b] = ',';
  basic[0x1c] = p[2];
  basic[0x1d] = p[3];
  basic[0x1e] = ',';
  basic[0x1f] = p[4];
  basic[0x20] = p[5];
  basic[0x21] = ',';
  basic[0x22] = p[6];
  basic[0x23] = p[7];
  basic[0x24] = ',';
  basic[0x25] = p[8];
  basic[0x26] = p[9];
  basic[0x27] = ',';
  basic[0x28] = p[10];
  basic[0x29] = p[0xb];
  basic[0x2a] = ',';
  basic[0x2b] = p[0xc];
  basic[0x2c] = p[0xd];
  basic[0x2d] = ',';
  basic[0x2e] = p[0xe];
  basic[0x2f] = p[0xf];
  basic[0x30] = ',';
  basic[0x31] = p[0x10];
  basic[0x32] = p[0x11];
  basic[0x33] = ',';
  basic[0x34] = p[0x12];
  basic[0x35] = p[0x13];
  basic[0x36] = ',';
  basic[0x37] = p[0x14];
  basic[0x38] = p[0x15];
  basic[0x39] = ',';
  basic[0x3a] = p[0x16];
  basic[0x3b] = p[0x17];
  basic[0x3c] = '\0';
  basic[0x3d] = '\x12';
  basic[0x3e] = '\0';
  basic[0x3f] = '\x1e';
  basic[0x40] = '\0';
  basic[0x41] = 0x9e;
  basic[0x42] = ' ';
  basic[0x43] = '\r';
  basic[0x44] = '\0';
  basic[0x45] = '\0';
  basic[0x46] = 0xe9;
  basic[0x47] = 0xef;
  basic[0x48] = '\x0e';
  basic[0x49] = ' ';
  basic[0x4a] = 0xec;
  basic[0x4b] = ' ';
  basic[0x4c] = '\x19';
  basic[0x4d] = '\x0f';
  basic[0x4e] = '\0';
  basic[0x4f] = '\x1e';
  basic[0x50] = '\0';
  basic[0x51] = '(';
  basic[0x52] = '\0';
  basic[0x53] = 0xc3;
  basic[0x54] = ' ';
  basic[0x55] = '\r';
  basic[0x56] = '\0';
  basic[0x57] = '\0';
  basic[0x58] = 0xf6;
  basic[0x59] = '\x01';
  basic[0x5a] = 0xa2;
  basic[0x5b] = ' ';
  basic[0x5c] = '\r';
  basic[0x5d] = '\0';
  basic[0x5e] = '\0';
  basic[0x5f] = 0xe9;
  basic[0x60] = ',';
  basic[0x61] = ' ';
  basic[0x62] = '\r';
  basic[99] = '\0';
  basic[100] = '\0';
  basic[0x65] = 0xf6;
  basic[0x66] = ',';
  basic[0x67] = ' ';
  basic[0x68] = '\r';
  basic[0x69] = '\0';
  basic[0x6a] = '\0';
  basic[0x6b] = 0xf6;
  basic[0x6c] = '\0';
  basic[0x6d] = '\v';
  basic[0x6e] = '\0';
  basic[0x6f] = '2';
  basic[0x70] = '\0';
  basic[0x71] = 0xb0;
  basic[0x72] = ' ';
  basic[0x73] = '\r';
  basic[0x74] = '\0';
  basic[0x75] = '\0';
  basic[0x76] = 0xe9;
  basic[0x77] = '\0';
  basic[0x78] = '\x14';
  basic[0x79] = '\0';
  basic[0x7a] = '<';
  basic[0x7b] = '\0';
  basic[0x7c] = 0xaa;
  basic[0x7d] = ' ';
  basic[0x7e] = '\x1c';
  basic[0x7f] = 0xff;
  basic[0x80] = '\x7f';
  basic[0x81] = '\x01';
  basic[0x82] = 0xa8;
  basic[0x83] = ' ';
  basic[0x84] = '\"';
  basic[0x85] = '!';
  basic[0x86] = 'c';
  basic[0x87] = 'o';
  basic[0x88] = 'd';
  basic[0x89] = 'e';
  basic[0x8a] = '\"';
  basic[0x8b] = '\0';
  basic[0x8c] = '\n';
  basic[0x8d] = '\0';
  basic[0x8e] = 'F';
  basic[0x8f] = '\0';
  basic[0x90] = 0x83;
  basic[0x91] = ' ';
  basic[0x92] = '\x1c';
  basic[0x93] = '\0';
  basic[0x94] = 0x80;
  basic[0x95] = '\0';
  basic[0x96] = '\0';
  basic[0x97] = '\0';
  local_fc = 0xa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"LOADER",&local_121);
  writeTapeFile(fname,&local_120,'\0',local_f8,0xa0,0x170,0,1000);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  return;
}

Assistant:

static void writeBASICLoader(const std::filesystem::path & fname, byte screenMode, const byte* palette) {
		constexpr byte mode_values[] = { 0x0E, 0x0F, 0x10 };
		byte border = 0;
		border = *palette;
		// Border is always the first entry in the palette
		++palette;

		// BASIC number encoding format for the palette entries
		byte p[32];
		for (aint i = 0, n = 0; i < 16; ++i, n+=2) {
			p[n] = (palette[i] / 10) + '0';
			p[n+1] = (palette[i] % 10) + '0';
		}

		const word callad = SaveCDT_AmstradCPC464_ORG;
		const word himem = callad - 1; // himem is one byte lower than the program we load

		// BASIC loader to set the screen mode, border color, palette, and then load the asm loader and execute it
		const byte basic[] = {
			// Line format <Line Len (int16)> <line no (int16)> <tokens...> <0x00>
			//
			//		10		MODE		N						:		CLS  :     BORDER		N
			15, 00, 10, 00, 0xAD, 0x20, mode_values[screenMode], 0x01, 0x8A, 0x01, 0x82, 0x20, 0x19, border, 0x00,
			//		20		DATA [16 bytes of int8]
			54, 00, 20, 00, 0x8C, 0x20, 
				p[0], p[1], ',', p[2], p[3], ',', p[4], p[5], ',', p[6], p[7], ',',
				p[8], p[9], ',', p[10], p[11], ',', p[12], p[13], ',', p[14], p[15], ',',
				p[16], p[17], ',', p[18], p[19], ',', p[20], p[21], ',', p[22], p[23], ',',
				p[24], p[25], ',', p[26], p[27], ',', p[28], p[29], ',', p[30], p[31], 0x00,
			//		30		FOR			i						=	  0			  TO		  15
			18, 00,	30, 00, 0x9E, 0x20, 0x0D, 0x00, 0x00, 0xE9, 0xEF, 0x0E, 0x20, 0xEC, 0x20, 0x19, 0x0F, 0x00,
			//		40		READ		v						:	  INK		  	i					  ,           v                       ,                             v
			30, 00, 40, 00, 0xC3, 0x20, 0x0D, 0x00, 0x00, 0xF6, 0x01, 0xA2, 0x20, 0x0D, 0x00, 0x00, 0xE9, 0x2C, 0x20, 0x0D, 0x00, 0x00, 0xF6, 0x2C, 0x20, 0x0D, 0x00, 0x00, 0xF6, 0x00,
			//		50		NEXT		i
			11, 00,	50, 00, 0xB0, 0x20, 0x0D, 0x00, 0x00, 0xE9, 0x00,
			//		60		MEMORY		&NNNN			  :		LOAD 
			20, 00, 60, 00, 0xAA, 0x20, 0x1C, himem & 0xFF, himem >> 8, 0x01,	0xA8, 0x20, 0x22, '!', 'c', 'o', 'd', 'e', 0x22, 0x00,
			//		70		CALL
			10, 00, 70, 00, 0x83, 0x20, 0x1C, callad & 0xFF, callad >> 8, 0x00,
			// EOF
			00, 00 
		};
		constexpr aint basiclen = sizeof(basic);
		writeTapeFile(fname, "LOADER", FileTypeBASIC, basic, basiclen, 0x0170, 0x0000, DefaultPause);
	}